

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteDouble1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,double C1)

{
  bool bVar1;
  undefined2 local_12;
  undefined1 auStack_10 [6];
  OpLayoutT_Double1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if (((DAT_0143bfdd != '\0') || (local_12 = (undefined2)R0, 0xffff < R0)) || (NAN(C1))) {
    bVar1 = false;
  }
  else {
    _auStack_10 = C1;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_12,10,
               &this->super_ByteCodeWriter,false);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteDouble1Const1(OpCodeAsmJs op, RegSlot R0, double C1)
    {
        OpLayoutT_Double1Const1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.D0, R0) && SizePolicy::Assign(layout.C1, C1))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }